

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalNinjaGenerator::ConvertToNinjaPath
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *path)

{
  cmOutputConverter::Convert
            (__return_storage_ptr__,
             &(*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start)->super_cmOutputConverter,path,HOME_OUTPUT,
             UNCHANGED);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::ConvertToNinjaPath(const std::string& path)
{
  cmLocalNinjaGenerator *ng =
    static_cast<cmLocalNinjaGenerator *>(this->LocalGenerators[0]);
  std::string convPath = ng->Convert(path, cmOutputConverter::HOME_OUTPUT);
#ifdef _WIN32
  cmSystemTools::ReplaceString(convPath, "/", "\\");
#endif
  return convPath;
}